

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprIfFalse(Parse *pParse,Expr *pExpr,int dest,int jumpIfNull)

{
  int iVar1;
  int iVar2;
  int destIfNull;
  int d2;
  int r2;
  int r1;
  int regFree2;
  int regFree1;
  int op;
  Vdbe *v;
  int jumpIfNull_local;
  int dest_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  _regFree1 = pParse->pVdbe;
  r1 = 0;
  r2 = 0;
  if ((_regFree1 != (Vdbe *)0x0) && (pExpr != (Expr *)0x0)) {
    regFree2 = (pExpr->op + 1 ^ 1) - 1;
    v._0_4_ = jumpIfNull;
    v._4_4_ = dest;
    _jumpIfNull_local = pExpr;
    pExpr_local = (Expr *)pParse;
    switch(pExpr->op) {
    case '\x13':
      sqlite3ExprIfTrue(pParse,pExpr->pLeft,dest,jumpIfNull);
      break;
    default:
      iVar2 = sqlite3ExprCodeTemp(pParse,pExpr,&r1);
      sqlite3VdbeAddOp3(_regFree1,0x1c,iVar2,v._4_4_,(uint)((uint)v != 0));
      break;
    case 'D':
      iVar2 = sqlite3VdbeMakeLabel(_regFree1);
      sqlite3ExprCachePush((Parse *)pExpr_local);
      sqlite3ExprIfTrue((Parse *)pExpr_local,_jumpIfNull_local->pLeft,iVar2,(uint)v ^ 8);
      sqlite3ExprIfFalse((Parse *)pExpr_local,_jumpIfNull_local->pRight,v._4_4_,(uint)v);
      sqlite3VdbeResolveLabel(_regFree1,iVar2);
      sqlite3ExprCachePop((Parse *)pExpr_local,1);
      break;
    case 'E':
      sqlite3ExprIfFalse(pParse,pExpr->pLeft,dest,jumpIfNull);
      sqlite3ExprIfFalse((Parse *)pExpr_local,_jumpIfNull_local->pRight,v._4_4_,(uint)v);
      break;
    case 'F':
    case 0x92:
      iVar2 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&r1);
      iVar1 = sqlite3ExprCodeTemp((Parse *)pExpr_local,_jumpIfNull_local->pRight,&r2);
      regFree2 = 0x4c;
      if (_jumpIfNull_local->op == 'F') {
        regFree2 = 0x4b;
      }
      codeCompare((Parse *)pExpr_local,_jumpIfNull_local->pLeft,_jumpIfNull_local->pRight,regFree2,
                  iVar2,iVar1,v._4_4_,0x80);
      break;
    case 'G':
      exprCodeBetween(pParse,pExpr,dest,0,jumpIfNull);
      break;
    case 'H':
      if (jumpIfNull == 0) {
        iVar2 = sqlite3VdbeMakeLabel(_regFree1);
        sqlite3ExprCodeIN((Parse *)pExpr_local,_jumpIfNull_local,v._4_4_,iVar2);
        sqlite3VdbeResolveLabel(_regFree1,iVar2);
      }
      else {
        sqlite3ExprCodeIN(pParse,pExpr,dest,dest);
      }
      break;
    case 'I':
    case 'J':
      iVar2 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&r1);
      sqlite3VdbeAddOp2(_regFree1,regFree2,iVar2,v._4_4_);
      break;
    case 'K':
    case 'L':
    case 'M':
    case 'N':
    case 'O':
    case 'P':
      iVar2 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&r1);
      iVar1 = sqlite3ExprCodeTemp((Parse *)pExpr_local,_jumpIfNull_local->pRight,&r2);
      codeCompare((Parse *)pExpr_local,_jumpIfNull_local->pLeft,_jumpIfNull_local->pRight,regFree2,
                  iVar2,iVar1,v._4_4_,(uint)v);
    }
    sqlite3ReleaseTempReg((Parse *)pExpr_local,r1);
    sqlite3ReleaseTempReg((Parse *)pExpr_local,r2);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprIfFalse(Parse *pParse, Expr *pExpr, int dest, int jumpIfNull){
  Vdbe *v = pParse->pVdbe;
  int op = 0;
  int regFree1 = 0;
  int regFree2 = 0;
  int r1, r2;

  assert( jumpIfNull==SQLITE_JUMPIFNULL || jumpIfNull==0 );
  if( NEVER(v==0) ) return; /* Existence of VDBE checked by caller */
  if( pExpr==0 )    return;

  /* The value of pExpr->op and op are related as follows:
  **
  **       pExpr->op            op
  **       ---------          ----------
  **       TK_ISNULL          OP_NotNull
  **       TK_NOTNULL         OP_IsNull
  **       TK_NE              OP_Eq
  **       TK_EQ              OP_Ne
  **       TK_GT              OP_Le
  **       TK_LE              OP_Gt
  **       TK_GE              OP_Lt
  **       TK_LT              OP_Ge
  **
  ** For other values of pExpr->op, op is undefined and unused.
  ** The value of TK_ and OP_ constants are arranged such that we
  ** can compute the mapping above using the following expression.
  ** Assert()s verify that the computation is correct.
  */
  op = ((pExpr->op+(TK_ISNULL&1))^1)-(TK_ISNULL&1);

  /* Verify correct alignment of TK_ and OP_ constants
  */
  assert( pExpr->op!=TK_ISNULL || op==OP_NotNull );
  assert( pExpr->op!=TK_NOTNULL || op==OP_IsNull );
  assert( pExpr->op!=TK_NE || op==OP_Eq );
  assert( pExpr->op!=TK_EQ || op==OP_Ne );
  assert( pExpr->op!=TK_LT || op==OP_Ge );
  assert( pExpr->op!=TK_LE || op==OP_Gt );
  assert( pExpr->op!=TK_GT || op==OP_Le );
  assert( pExpr->op!=TK_GE || op==OP_Lt );

  switch( pExpr->op ){
    case TK_AND: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfFalse(pParse, pExpr->pLeft, dest, jumpIfNull);
      sqlite3ExprIfFalse(pParse, pExpr->pRight, dest, jumpIfNull);
      break;
    }
    case TK_OR: {
      int d2 = sqlite3VdbeMakeLabel(v);
      testcase( jumpIfNull==0 );
      sqlite3ExprCachePush(pParse);
      sqlite3ExprIfTrue(pParse, pExpr->pLeft, d2, jumpIfNull^SQLITE_JUMPIFNULL);
      sqlite3ExprIfFalse(pParse, pExpr->pRight, dest, jumpIfNull);
      sqlite3VdbeResolveLabel(v, d2);
      sqlite3ExprCachePop(pParse, 1);
      break;
    }
    case TK_NOT: {
      testcase( jumpIfNull==0 );
      sqlite3ExprIfTrue(pParse, pExpr->pLeft, dest, jumpIfNull);
      break;
    }
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      testcase( op==TK_LT );
      testcase( op==TK_LE );
      testcase( op==TK_GT );
      testcase( op==TK_GE );
      testcase( op==TK_EQ );
      testcase( op==TK_NE );
      testcase( jumpIfNull==0 );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, jumpIfNull);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_IS:
    case TK_ISNOT: {
      testcase( pExpr->op==TK_IS );
      testcase( pExpr->op==TK_ISNOT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      op = (pExpr->op==TK_IS) ? TK_NE : TK_EQ;
      codeCompare(pParse, pExpr->pLeft, pExpr->pRight, op,
                  r1, r2, dest, SQLITE_NULLEQ);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      testcase( op==TK_ISNULL );
      testcase( op==TK_NOTNULL );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      sqlite3VdbeAddOp2(v, op, r1, dest);
      testcase( regFree1==0 );
      break;
    }
    case TK_BETWEEN: {
      testcase( jumpIfNull==0 );
      exprCodeBetween(pParse, pExpr, dest, 0, jumpIfNull);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_IN: {
      if( jumpIfNull ){
        sqlite3ExprCodeIN(pParse, pExpr, dest, dest);
      }else{
        int destIfNull = sqlite3VdbeMakeLabel(v);
        sqlite3ExprCodeIN(pParse, pExpr, dest, destIfNull);
        sqlite3VdbeResolveLabel(v, destIfNull);
      }
      break;
    }
#endif
    default: {
      r1 = sqlite3ExprCodeTemp(pParse, pExpr, &regFree1);
      sqlite3VdbeAddOp3(v, OP_IfNot, r1, dest, jumpIfNull!=0);
      testcase( regFree1==0 );
      testcase( jumpIfNull==0 );
      break;
    }
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
}